

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

void DrawTextCodepoint(Font font,int codepoint,Vector2 position,float fontSize,Color tint)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  CharInfo *pCVar10;
  float fVar11;
  float fVar12;
  Rectangle source;
  Rectangle dest;
  
  uVar9 = 0;
  uVar8 = (ulong)(uint)font.charsCount;
  if (font.charsCount < 1) {
    uVar8 = uVar9;
  }
  for (pCVar10 = font.chars;
      (uVar7 = 0x3f, uVar8 != uVar9 && (uVar7 = uVar9, pCVar10->value != codepoint));
      pCVar10 = pCVar10 + 1) {
    uVar9 = uVar9 + 1;
  }
  fVar12 = fontSize / (float)font.baseSize;
  fVar11 = (float)font.charsPadding;
  uVar1 = font.chars[uVar7].offsetX;
  uVar4 = font.chars[uVar7].offsetY;
  dest.x = ((float)(int)uVar1 * fVar12 + position.x) - fVar11 * fVar12;
  dest.y = ((float)(int)uVar4 * fVar12 + position.y) - fVar11 * fVar12;
  uVar2 = font.recs[uVar7].x;
  uVar5 = font.recs[uVar7].y;
  uVar3 = font.recs[uVar7].width;
  uVar6 = font.recs[uVar7].height;
  source.x = (float)uVar2 - fVar11;
  source.y = (float)uVar5 - fVar11;
  source.width = fVar11 + fVar11 + (float)uVar3;
  source.height = fVar11 + fVar11 + (float)uVar6;
  dest.width = fVar12 * source.width;
  dest.height = fVar12 * source.height;
  DrawTexturePro(font.texture,source,dest,(Vector2)0x0,0.0,tint);
  return;
}

Assistant:

void DrawTextCodepoint(Font font, int codepoint, Vector2 position, float fontSize, Color tint)
{
    // Character index position in sprite font
    // NOTE: In case a codepoint is not available in the font, index returned points to '?'
    int index = GetGlyphIndex(font, codepoint);
    float scaleFactor = fontSize/font.baseSize;     // Character quad scaling factor

    // Character destination rectangle on screen
    // NOTE: We consider charsPadding on drawing
    Rectangle dstRec = { position.x + font.chars[index].offsetX*scaleFactor - (float)font.charsPadding*scaleFactor,
                      position.y + font.chars[index].offsetY*scaleFactor - (float)font.charsPadding*scaleFactor,
                      (font.recs[index].width + 2.0f*font.charsPadding)*scaleFactor,
                      (font.recs[index].height + 2.0f*font.charsPadding)*scaleFactor };

    // Character source rectangle from font texture atlas
    // NOTE: We consider chars padding when drawing, it could be required for outline/glow shader effects
    Rectangle srcRec = { font.recs[index].x - (float)font.charsPadding, font.recs[index].y - (float)font.charsPadding,
                         font.recs[index].width + 2.0f*font.charsPadding, font.recs[index].height + 2.0f*font.charsPadding };

    // Draw the character texture on the screen
    DrawTexturePro(font.texture, srcRec, dstRec, (Vector2){ 0, 0 }, 0.0f, tint);
}